

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.cpp
# Opt level: O2

TypedFlatImageChannel<Imath_3_2::half> * __thiscall
Imf_3_2::TypedFlatImageChannel<Imath_3_2::half>::slice(TypedFlatImageChannel<Imath_3_2::half> *this)

{
  PixelType PVar1;
  undefined8 *in_RSI;
  
  PVar1 = (**(code **)*in_RSI)();
  Imf_3_2::Slice::Slice
            ((Slice *)this,PVar1,(char *)in_RSI[7],2,(long)*(int *)((long)in_RSI + 0x1c) * 2,
             *(int *)(in_RSI + 2),*(int *)((long)in_RSI + 0x14),0.0,false,false);
  return this;
}

Assistant:

Slice
TypedFlatImageChannel<T>::slice () const
{
    return Slice (
        pixelType (),                 // type
        (char*) _base,                // base
        sizeof (T),                   // xStride
        pixelsPerRow () * sizeof (T), // yStride
        xSampling (),
        ySampling ());
}